

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

SequenceDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SequenceDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::AssertionItemPortListSyntax*&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::LocalVariableDeclarationSyntax>const&,slang::syntax::SequenceExprSyntax&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,AssertionItemPortListSyntax **args_3,Token *args_4,
          SyntaxList<slang::syntax::LocalVariableDeclarationSyntax> *args_5,
          SequenceExprSyntax *args_6,Token *args_7,Token *args_8,NamedBlockClauseSyntax **args_9)

{
  Token keyword;
  Token name;
  Token semi;
  Token optionalSemi;
  Token end;
  SequenceDeclarationSyntax *this_00;
  
  this_00 = (SequenceDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SequenceDeclarationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (SequenceDeclarationSyntax *)allocateSlow(this,0xd8,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  name.kind = args_2->kind;
  name._2_1_ = args_2->field_0x2;
  name.numFlags.raw = (args_2->numFlags).raw;
  name.rawLen = args_2->rawLen;
  name.info = args_2->info;
  end.kind = args_8->kind;
  end._2_1_ = args_8->field_0x2;
  end.numFlags.raw = (args_8->numFlags).raw;
  end.rawLen = args_8->rawLen;
  end.info = args_8->info;
  optionalSemi.kind = args_7->kind;
  optionalSemi._2_1_ = args_7->field_0x2;
  optionalSemi.numFlags.raw = (args_7->numFlags).raw;
  optionalSemi.rawLen = args_7->rawLen;
  optionalSemi.info = args_7->info;
  semi.kind = args_4->kind;
  semi._2_1_ = args_4->field_0x2;
  semi.numFlags.raw = (args_4->numFlags).raw;
  semi.rawLen = args_4->rawLen;
  semi.info = args_4->info;
  slang::syntax::SequenceDeclarationSyntax::SequenceDeclarationSyntax
            (this_00,args,keyword,name,*args_3,semi,args_5,args_6,optionalSemi,end,*args_9);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }